

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
EnrichableI2cAnalyzerSettings::EnrichableI2cAnalyzerSettings(EnrichableI2cAnalyzerSettings *this)

{
  Channel *this_00;
  Channel *this_01;
  auto_ptr<AnalyzerSettingInterfaceChannel> *paVar1;
  AnalyzerSettingInterfaceChannel *pAVar2;
  AnalyzerSettingInterfaceNumberList *pAVar3;
  AnalyzerSettingInterfaceText *pAVar4;
  AnalyzerSettingInterfaceChannel *pAVar5;
  AnalyzerSettingInterfaceNumberList *this_02;
  AnalyzerSettingInterfaceText *this_03;
  ulong uVar6;
  Channel *pCVar7;
  char *pcVar8;
  uint uVar9;
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__EnrichableI2cAnalyzerSettings_00110d20;
  this_00 = &this->mSdaChannel;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this_01 = &this->mSclChannel;
  uVar6 = 0xffffffffffffffff;
  Channel::Channel(this_01,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mAddressDisplay = YES_DIRECTION_8;
  this->mParserCommand = "";
  paVar1 = &this->mSdaChannelInterface;
  (this->mSdaChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mSclChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mAddressDisplayInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mParserCommandInterface)._M_ptr = (AnalyzerSettingInterfaceText *)0x0;
  pAVar5 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar5);
  pAVar2 = paVar1->_M_ptr;
  if (pAVar2 != pAVar5) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    paVar1->_M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)paVar1->_M_ptr,"SDA");
  pCVar7 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)paVar1->_M_ptr);
  pAVar5 = (AnalyzerSettingInterfaceChannel *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(pAVar5);
  pAVar2 = (this->mSclChannelInterface)._M_ptr;
  if (pAVar2 != pAVar5) {
    if (pAVar2 != (AnalyzerSettingInterfaceChannel *)0x0) {
      (**(code **)(*(long *)pAVar2 + 8))();
    }
    (this->mSclChannelInterface)._M_ptr = pAVar5;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)(this->mSclChannelInterface)._M_ptr,"SCL");
  pCVar7 = this_01;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)(this->mSclChannelInterface)._M_ptr);
  this_02 = (AnalyzerSettingInterfaceNumberList *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(this_02);
  pAVar3 = (this->mAddressDisplayInterface)._M_ptr;
  if (pAVar3 != this_02) {
    if (pAVar3 != (AnalyzerSettingInterfaceNumberList *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))();
    }
    (this->mAddressDisplayInterface)._M_ptr = this_02;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mAddressDisplayInterface)._M_ptr,"Address Display");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)(this->mAddressDisplayInterface)._M_ptr,
             "8-bit, read/write bit included [default]");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)(this->mAddressDisplayInterface)._M_ptr,"8-bit, read/write bit set as 0");
  pcVar8 = "7-bit, address bits only";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)(this->mAddressDisplayInterface)._M_ptr,"7-bit, address bits only");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mAddressDisplay);
  this_03 = (AnalyzerSettingInterfaceText *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar8);
  AnalyzerSettingInterfaceText::AnalyzerSettingInterfaceText(this_03);
  pAVar4 = (this->mParserCommandInterface)._M_ptr;
  if (pAVar4 != this_03) {
    if (pAVar4 != (AnalyzerSettingInterfaceText *)0x0) {
      (**(code **)(*(long *)pAVar4 + 8))();
    }
    (this->mParserCommandInterface)._M_ptr = this_03;
  }
  AnalyzerSettingInterface::SetTitleAndTooltip
            ((char *)(this->mParserCommandInterface)._M_ptr,"Enrichment Script");
  AnalyzerSettingInterfaceText::SetTextType((TextType)(this->mParserCommandInterface)._M_ptr);
  AnalyzerSettingInterfaceText::SetText((char *)(this->mParserCommandInterface)._M_ptr);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar9 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar9,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar9,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar9,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_01,true);
  return;
}

Assistant:

EnrichableI2cAnalyzerSettings::EnrichableI2cAnalyzerSettings()
:	mSdaChannel( UNDEFINED_CHANNEL ),
	mSclChannel( UNDEFINED_CHANNEL ),
	mAddressDisplay( YES_DIRECTION_8 ),
	mParserCommand("")
{
	mSdaChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mSdaChannelInterface->SetTitleAndTooltip( "SDA", "Serial Data Line" );
	mSdaChannelInterface->SetChannel( mSdaChannel );

	mSclChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
	mSclChannelInterface->SetTitleAndTooltip( "SCL", "Serial Clock Line" );
	mSclChannelInterface->SetChannel( mSclChannel );

	mAddressDisplayInterface.reset( new AnalyzerSettingInterfaceNumberList() );
	mAddressDisplayInterface->SetTitleAndTooltip( "Address Display", "Specify how you would like the I2C address to be displayed." );
	mAddressDisplayInterface->AddNumber( YES_DIRECTION_8, "8-bit, read/write bit included [default]", "Displays the address as it would be seen in a microcontroller register (with the read/write bit included)" );
	mAddressDisplayInterface->AddNumber( NO_DIRECTION_8, "8-bit, read/write bit set as 0", "Displays the I2C address as an 8 bit number, but uses 0 in place of the read/write bit" );
	mAddressDisplayInterface->AddNumber( NO_DIRECTION_7, "7-bit, address bits only", "Displays the I2C address as a 7-bit number" );
	mAddressDisplayInterface->SetNumber( mAddressDisplay );

	mParserCommandInterface.reset(new AnalyzerSettingInterfaceText());
	mParserCommandInterface->SetTitleAndTooltip("Enrichment Script", "Command to run for enriching displayed I2C data.");
	mParserCommandInterface->SetTextType(AnalyzerSettingInterfaceText::NormalText);
	mParserCommandInterface->SetText(mParserCommand);

	AddInterface( mSdaChannelInterface.get() );
	AddInterface( mSclChannelInterface.get() );
	AddInterface( mAddressDisplayInterface.get() );
	AddInterface( mParserCommandInterface.get() );

	//AddExportOption( 0, "Export as text/csv file", "text (*.txt);;csv (*.csv)" );
	AddExportOption( 0, "Export as text/csv file" );
	AddExportExtension( 0, "text", "txt" );
	AddExportExtension( 0, "csv", "csv" );

	ClearChannels();
	AddChannel( mSdaChannel, "SDA", false );
	AddChannel( mSclChannel, "SCL", false );
}